

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O0

void cards_reverse(Card **cards,uchar cardsCount)

{
  Card *pCVar1;
  code *pcVar2;
  Card *card;
  uchar end;
  uchar start;
  uchar cardsCount_local;
  Card **cards_local;
  
  start = '\0';
  end = cardsCount + 0xff;
  if (!SBORROW4((uint)cardsCount,1)) {
    for (; start < end; start = start + '\x01') {
      pCVar1 = cards[start];
      cards[start] = cards[end];
      cards[end] = pCVar1;
      end = end + 0xff;
    }
    return;
  }
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void cards_reverse(Card ** cards, unsigned char cardsCount)
{
	unsigned char start=0;
	unsigned char end=cardsCount-1;
	Card * card;
	while(start<end)
	{
		card = cards[start];
		cards[start] = cards[end];
		cards[end] = card;
		start++;
		end--;
	}
}